

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry_bp.c
# Opt level: O2

int main(void)

{
  double dVar1;
  int iVar2;
  int iVar3;
  N_Vector u;
  void *pvVar4;
  void *returnvalue;
  void *returnvalue_00;
  undefined8 *puVar5;
  char *pcVar6;
  bool bVar7;
  undefined4 local_110;
  int retval;
  int retval_1;
  undefined4 uStack_104;
  void *local_100;
  SUNContext sunctx;
  void *local_f0;
  int qu;
  undefined4 uStack_e4;
  sunrealtype hu;
  long nst;
  int local_cc;
  void *local_c8;
  double local_c0;
  long nfeBP;
  long nfeLS;
  void *local_a8;
  sunrealtype local_a0;
  sunrealtype t;
  long ncfl;
  long nps;
  long npe;
  long nli;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst_1;
  long leniwBP;
  long lenrwBP;
  
  retval = SUNContext_Create(0,&sunctx);
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    u = (N_Vector)N_VNew_Serial(200,sunctx);
    iVar2 = check_retval(u,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      pvVar4 = malloc(0x38);
      iVar2 = check_retval(pvVar4,"malloc",2);
      if (iVar2 == 0) {
        *(undefined8 *)((long)pvVar4 + 8) = 0x3f13104b57cf96af;
        *(undefined8 *)((long)pvVar4 + 0x10) = 0x4001c71c71c71c72;
        *(undefined8 *)((long)pvVar4 + 0x18) = 0x4001c71c71c71c72;
        *(undefined8 *)((long)pvVar4 + 0x20) = 0x3eab2dd8d6457178;
        *(undefined8 *)((long)pvVar4 + 0x28) = 0x3f2d7dbf487fcb92;
        *(undefined8 *)((long)pvVar4 + 0x30) = 0x3e216505a7da8610;
        SetInitialProfiles(u,2.2222222222222223,2.2222222222222223);
        returnvalue = (void *)CVodeCreate(2,sunctx);
        local_f0 = returnvalue;
        iVar2 = check_retval(returnvalue,"CVodeCreate",0);
        if (iVar2 == 0) {
          retval = CVodeSetUserData(returnvalue,pvVar4);
          iVar2 = check_retval(&retval,"CVodeSetUserData",1);
          if (iVar2 == 0) {
            retval = CVodeInit(0,returnvalue,f,u);
            iVar2 = check_retval(&retval,"CVodeInit",1);
            if (iVar2 == 0) {
              retval = CVodeSStolerances(0x88e368f1,0x3f50624dd2f1a9fc,returnvalue);
              iVar2 = check_retval(&retval,"CVodeSStolerances",1);
              if (iVar2 == 0) {
                returnvalue_00 = (void *)SUNLinSol_SPGMR(u,1,0,sunctx);
                iVar2 = check_retval(returnvalue_00,"SUNLinSol_SPGMR",0);
                if (iVar2 == 0) {
                  retval = CVodeSetLinearSolver(returnvalue,returnvalue_00,0);
                  iVar2 = check_retval(&retval,"CVodeSetLinearSolver",1);
                  if (iVar2 == 0) {
                    local_a8 = returnvalue_00;
                    retval = CVBandPrecInit(returnvalue,200,2,2);
                    printf("2-species diurnal advection-diffusion problem, %d by %d mesh\n",10);
                    printf("SPGMR solver; band preconditioner; mu = %ld, ml = %ld\n\n",2,2);
                    iVar2 = 1;
                    local_c8 = pvVar4;
                    do {
                      pvVar4 = local_a8;
                      if (iVar2 == 2) {
                        SetInitialProfiles(u,*(sunrealtype *)((long)local_c8 + 0x10),
                                           *(sunrealtype *)((long)local_c8 + 0x18));
                        local_100 = local_f0;
                        retval = CVodeReInit(0,local_f0,u);
                        iVar3 = check_retval(&retval,"CVodeReInit",1);
                        if (iVar3 != 0) {
                          return 1;
                        }
                        retval = SUNLinSol_SPGMRSetPrecType(pvVar4,2);
                        iVar3 = check_retval(&retval,"SUNLinSol_SPGMRSetPrecType",1);
                        if (iVar3 != 0) {
                          return 1;
                        }
                        retval = CVBandPrecInit(local_100,200,2);
                        printf("\n\n-------------------------------------------------------");
                        puts("------------");
                      }
                      else {
                        if (iVar2 == 3) {
                          N_VDestroy(u);
                          free(local_c8);
                          CVodeFree(&local_f0);
                          SUNLinSolFree(pvVar4);
                          SUNContext_Free(&sunctx);
                          return 0;
                        }
                        local_100 = local_f0;
                      }
                      pcVar6 = "SUN_PREC_RIGHT";
                      if (iVar2 == 1) {
                        pcVar6 = "SUN_PREC_LEFT";
                      }
                      local_cc = iVar2;
                      printf("\n\nPreconditioner type is:  jpre = %s\n\n",pcVar6);
                      iVar2 = 0xc;
                      dVar1 = 7200.0;
                      while( true ) {
                        pvVar4 = local_100;
                        bVar7 = iVar2 == 0;
                        iVar2 = iVar2 + -1;
                        if (bVar7) break;
                        local_c0 = dVar1;
                        retval = CVode(SUB84(dVar1,0),local_100,u,&t,1);
                        check_retval(&retval,"CVode",1);
                        local_a0 = t;
                        puVar5 = (undefined8 *)N_VGetArrayPointer(u);
                        retval_1 = CVodeGetNumSteps(pvVar4,&nst);
                        check_retval(&retval_1,"CVodeGetNumSteps",1);
                        retval_1 = CVodeGetLastOrder(pvVar4,&qu);
                        check_retval(&retval_1,"CVodeGetLastOrder",1);
                        retval_1 = CVodeGetLastStep(pvVar4,&hu);
                        check_retval(&retval_1,"CVodeGetLastStep",1);
                        printf("t = %.2e   no. steps = %ld   order = %d   stepsize = %.2e\n",
                               SUB84(local_a0,0),hu,nst,(ulong)(uint)qu);
                        printf("c1 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n",
                               (int)*puVar5,puVar5[0x58],puVar5[0xc6]);
                        printf("c2 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n\n",
                               (int)puVar5[1],puVar5[0x59],puVar5[199]);
                        if (retval != 0) break;
                        dVar1 = local_c0 + 7200.0;
                      }
                      pvVar4 = local_100;
                      local_110 = CVodeGetWorkSpace(local_100,&nst,&hu);
                      check_retval(&local_110,"CVodeGetWorkSpace",1);
                      local_110 = CVodeGetNumSteps(pvVar4,&nst_1);
                      check_retval(&local_110,"CVodeGetNumSteps",1);
                      local_110 = CVodeGetNumRhsEvals(pvVar4,&nfe);
                      check_retval(&local_110,"CVodeGetNumRhsEvals",1);
                      local_110 = CVodeGetNumLinSolvSetups(pvVar4,&nsetups);
                      check_retval(&local_110,"CVodeGetNumLinSolvSetups",1);
                      local_110 = CVodeGetNumErrTestFails(pvVar4,&netf);
                      check_retval(&local_110,"CVodeGetNumErrTestFails",1);
                      local_110 = CVodeGetNumNonlinSolvIters(pvVar4,&nni);
                      check_retval(&local_110,"CVodeGetNumNonlinSolvIters",1);
                      local_110 = CVodeGetNumNonlinSolvConvFails(pvVar4,&ncfn);
                      check_retval(&local_110,"CVodeGetNumNonlinSolvConvFails",1);
                      local_110 = CVodeGetLinWorkSpace(pvVar4,&qu,&retval_1);
                      check_retval(&local_110,"CVodeGetLinWorkSpace",1);
                      local_110 = CVodeGetNumLinIters(pvVar4,&nli);
                      check_retval(&local_110,"CVodeGetNumLinIters",1);
                      local_110 = CVodeGetNumPrecEvals(pvVar4,&npe);
                      check_retval(&local_110,"CVodeGetNumPrecEvals",1);
                      local_110 = CVodeGetNumPrecSolves(pvVar4,&nps);
                      check_retval(&local_110,"CVodeGetNumPrecSolves",1);
                      local_110 = CVodeGetNumLinConvFails(pvVar4,&ncfl);
                      check_retval(&local_110,"CVodeGetNumLinConvFails",1);
                      local_110 = CVodeGetNumLinRhsEvals(pvVar4,&nfeLS);
                      check_retval(&local_110,"CVodeGetNumLinRhsEvals",1);
                      local_110 = CVBandPrecGetWorkSpace(pvVar4,&lenrwBP,&leniwBP);
                      check_retval(&local_110,"CVBandPrecGetWorkSpace",1);
                      local_110 = CVBandPrecGetNumRhsEvals(pvVar4,&nfeBP);
                      check_retval(&local_110,"CVBandPrecGetNumRhsEvals",1);
                      puts("\nFinal Statistics.. \n");
                      printf("lenrw   = %5ld     leniw   = %5ld\n",nst,hu);
                      printf("lenrwls = %5ld     leniwls = %5ld\n",CONCAT44(uStack_e4,qu),
                             CONCAT44(uStack_104,retval_1));
                      printf("lenrwbp = %5ld     leniwbp = %5ld\n",lenrwBP,leniwBP);
                      printf("nst     = %5ld\n",nst_1);
                      printf("nfe     = %5ld     nfetot  = %5ld\n",nfe,nfeLS + nfe + nfeBP);
                      printf("nfeLS   = %5ld     nfeBP   = %5ld\n",nfeLS,nfeBP);
                      printf("nni     = %5ld     nli     = %5ld\n",nni,nli);
                      printf("nsetups = %5ld     netf    = %5ld\n",nsetups,netf);
                      printf("npe     = %5ld     nps     = %5ld\n",npe,nps);
                      printf("ncfn    = %5ld     ncfl    = %5ld\n\n",ncfn,ncfl);
                      iVar2 = local_cc + 1;
                    } while( true );
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype abstol, reltol, t, tout;
  N_Vector u;
  UserData data;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout, jpre;
  sunindextype ml, mu;

  u         = NULL;
  data      = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize u, and set problem data and tolerances */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  InitUserData(data);
  SetInitialProfiles(u, data->dx, data->dy);
  abstol = ATOL;
  reltol = RTOL;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the initial time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR
   * with left preconditioning and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(u, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Call CVodeSetLinearSolver to attach the linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Call CVBandPreInit to initialize band preconditioner */
  ml = mu = 2;
  retval  = CVBandPrecInit(cvode_mem, NEQ, mu, ml);
  if (check_retval(&retval, "CVBandPrecInit", 0)) { return (1); }

  PrintIntro(mu, ml);

  /* Loop over jpre (= SUN_PREC_LEFT, SUN_PREC_RIGHT), and solve the problem */

  for (jpre = SUN_PREC_LEFT; jpre <= SUN_PREC_RIGHT; jpre++)
  {
    /* On second run, re-initialize u, the solver, and SPGMR */

    if (jpre == SUN_PREC_RIGHT)
    {
      SetInitialProfiles(u, data->dx, data->dy);

      retval = CVodeReInit(cvode_mem, T0, u);
      if (check_retval(&retval, "CVodeReInit", 1)) { return (1); }

      retval = SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_RIGHT);
      if (check_retval(&retval, "SUNLinSol_SPGMRSetPrecType", 1))
      {
        return (1);
      }

      retval = CVBandPrecInit(cvode_mem, NEQ, mu, ml);
      if (check_retval(&retval, "CVBandPrecInit", 0)) { return (1); }

      printf("\n\n-------------------------------------------------------");
      printf("------------\n");
    }

    printf("\n\nPreconditioner type is:  jpre = %s\n\n",
           (jpre == SUN_PREC_LEFT) ? "SUN_PREC_LEFT" : "SUN_PREC_RIGHT");

    /* In loop over output points, call CVode, print results, test for error */

    for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
    {
      retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
      check_retval(&retval, "CVode", 1);
      PrintOutput(cvode_mem, u, t);
      if (retval != CV_SUCCESS) { break; }
    }

    /* Print final statistics */

    PrintFinalStats(cvode_mem);

  } /* End of jpre loop */

  /* Free memory */
  N_VDestroy(u);
  free(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNContext_Free(&sunctx);

  return (0);
}